

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.h
# Opt level: O1

QImage * __thiscall
QImage::convertToFormat
          (QImage *__return_storage_ptr__,QImage *this,Format f,ImageConversionFlags flags)

{
  QImageData *pQVar1;
  bool bVar2;
  
  bVar2 = convertToFormat_inplace(this,f,flags);
  if (bVar2) {
    QPaintDevice::QPaintDevice(&__return_storage_ptr__->super_QPaintDevice);
    (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
         (_func_int **)&PTR__QImage_007e2f38;
    pQVar1 = this->d;
    this->d = (QImageData *)0x0;
    __return_storage_ptr__->d = pQVar1;
  }
  else {
    convertToFormat_helper(__return_storage_ptr__,this,f,flags);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QImage convertToFormat(Format f, Qt::ImageConversionFlags flags = Qt::AutoColor) &&
    {
        if (convertToFormat_inplace(f, flags))
            return std::move(*this);
        else
            return convertToFormat_helper(f, flags);
    }